

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t * Gia_SimRsbTfo(Gia_SimRsbMan_t *p,int iObj,int iFanout)

{
  int iVar1;
  int iFanout_local;
  int iObj_local;
  Gia_SimRsbMan_t *p_local;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b3,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  Vec_IntClear(p->vTfo);
  Gia_ManIncrementTravId(p->pGia);
  Gia_SimRsbTfo_rec(p->pGia,iObj,iFanout,p->vTfo);
  iVar1 = Vec_IntEntryLast(p->vTfo);
  if (iVar1 == iObj) {
    Vec_IntPop(p->vTfo);
    Vec_IntReverseOrder(p->vTfo);
    Vec_IntSort(p->vTfo,0);
    return p->vTfo;
  }
  __assert_fail("Vec_IntEntryLast(p->vTfo) == iObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x1b7,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
}

Assistant:

Vec_Int_t * Gia_SimRsbTfo( Gia_SimRsbMan_t * p, int iObj, int iFanout )
{
    assert( iObj > 0 );
    Vec_IntClear( p->vTfo );
    Gia_ManIncrementTravId( p->pGia );
    Gia_SimRsbTfo_rec( p->pGia, iObj, iFanout, p->vTfo );
    assert( Vec_IntEntryLast(p->vTfo) == iObj );
    Vec_IntPop( p->vTfo );
    Vec_IntReverseOrder( p->vTfo );
    Vec_IntSort( p->vTfo, 0 );
    return p->vTfo;
}